

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O2

string_t __thiscall
duckdb::SHA256Operator::Operation<duckdb::string_t,duckdb::string_t>
          (SHA256Operator *this,string_t input,Vector *result)

{
  char *out;
  anon_union_16_2_67f50693_for_value aVar1;
  SHA256State state;
  string_t hash;
  string local_48;
  string_t input_local;
  
  input_local.value.pointer.ptr = (char *)input.value._0_8_;
  input_local.value._0_8_ = this;
  aVar1.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::EmptyString(input.value._8_8_,(Vector *)0x40,(idx_t)input.value._8_8_);
  hash.value = (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer
  ;
  duckdb_mbedtls::MbedTlsWrapper::SHA256State::SHA256State(&state);
  string_t::GetString_abi_cxx11_(&local_48,&input_local);
  duckdb_mbedtls::MbedTlsWrapper::SHA256State::AddString(&state,&local_48);
  ::std::__cxx11::string::~string((string *)&local_48);
  out = aVar1.pointer.ptr;
  if (aVar1.pointer.length < 0xd) {
    out = hash.value.pointer.prefix;
  }
  duckdb_mbedtls::MbedTlsWrapper::SHA256State::FinishHex(&state,out);
  string_t::Finalize(&hash);
  duckdb_mbedtls::MbedTlsWrapper::SHA256State::~SHA256State(&state);
  return (string_t)hash.value;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto hash = StringVector::EmptyString(result, duckdb_mbedtls::MbedTlsWrapper::SHA256_HASH_LENGTH_TEXT);

		duckdb_mbedtls::MbedTlsWrapper::SHA256State state;
		state.AddString(input.GetString());
		state.FinishHex(hash.GetDataWriteable());

		hash.Finalize();
		return hash;
	}